

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O1

void iterate_rc4(uchar *data,size_t data_len,uchar *okey,int key_len,int iterations,bool reverse)

{
  uint uVar1;
  RC4_KEY *key;
  undefined4 in_register_0000000c;
  uchar *indata;
  type ii;
  int iVar2;
  undefined4 in_register_00000084;
  uint uVar3;
  RC4 rc4;
  RC4 local_40;
  
  indata = (uchar *)CONCAT44(in_register_0000000c,key_len);
  iVar2 = iterations;
  if (key_len < 0) {
    QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(key_len);
  }
  key = (RC4_KEY *)operator_new__((long)key_len);
  uVar3 = 0;
  memset(key,0,(long)key_len);
  if (0 < iterations) {
    do {
      if (0 < key_len) {
        uVar1 = ~uVar3 + iterations;
        if (!reverse) {
          uVar1 = uVar3;
        }
        indata = (uchar *)0x0;
        do {
          indata[(long)(key->data + -2)] = okey[(long)indata] ^ (byte)uVar1;
          indata = indata + 1;
        } while ((uchar *)(ulong)(uint)key_len != indata);
      }
      RC4::RC4(&local_40,key,(ulong)(uint)key_len,indata,
               (uchar *)CONCAT44(in_register_00000084,iVar2));
      indata = data;
      RC4::process(&local_40,data,data_len,data);
      if (local_40.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != iterations);
  }
  operator_delete__(key);
  return;
}

Assistant:

static void
iterate_rc4(
    unsigned char* data,
    size_t data_len,
    unsigned char* okey,
    int key_len,
    int iterations,
    bool reverse)
{
    auto key_ph = std::make_unique<unsigned char[]>(QIntC::to_size(key_len));
    unsigned char* key = key_ph.get();
    for (int i = 0; i < iterations; ++i) {
        int const xor_value = (reverse ? iterations - 1 - i : i);
        for (int j = 0; j < key_len; ++j) {
            key[j] = static_cast<unsigned char>(okey[j] ^ xor_value);
        }
        RC4 rc4(key, QIntC::to_int(key_len));
        rc4.process(data, data_len, data);
    }
}